

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_exception_handler_test.cpp
# Opt level: O3

void __thiscall
StdExceptionCatcher_Tests::std_exception_catcher_with_custom_action::test_method
          (std_exception_catcher_with_custom_action *this)

{
  logic_error *this_00;
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_std_exception_handler_test_cpp:125:58)>
  catcher;
  int hit;
  
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"std::exception!");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

BOOST_AUTO_TEST_CASE(std_exception_catcher_with_custom_action)
{
   int hit = 0;
   {
      auto catcher = std_exception_handler(EXIT_FAILURE, [&hit](std::exception&){++hit;}, UnHandler<int>());
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(0, hit);
         BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
         BOOST_CHECK_EQUAL(1, hit);
      }
   }
   {
      auto catcher = std_exception_handler(EXIT_FAILURE, [&hit](std::exception&){++hit;}); // with default nested handler
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(1, hit);
         BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
         BOOST_CHECK_EQUAL(2, hit);
      }
   }
}